

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_core.cc
# Opt level: O0

void __thiscall
webrtc::DivergentFilterFraction::AddObservation
          (DivergentFilterFraction *this,PowerLevel *nearlevel,PowerLevel *linoutlevel,
          PowerLevel *nlpoutlevel)

{
  bool bVar1;
  double *pdVar2;
  float fVar3;
  double dVar4;
  float local_64;
  double local_48;
  double local_40;
  undefined1 local_31;
  float local_30;
  float fStack_2c;
  bool output_signal_active;
  float level_increase;
  float near_level;
  PowerLevel *nlpoutlevel_local;
  PowerLevel *linoutlevel_local;
  PowerLevel *nearlevel_local;
  DivergentFilterFraction *this_local;
  
  _level_increase = nlpoutlevel;
  nlpoutlevel_local = linoutlevel;
  linoutlevel_local = nearlevel;
  nearlevel_local = (PowerLevel *)this;
  fStack_2c = BlockMeanCalculator::GetLatestMean(&nearlevel->framelevel);
  local_30 = BlockMeanCalculator::GetLatestMean(&nlpoutlevel_local->framelevel);
  local_30 = local_30 - fStack_2c;
  fVar3 = BlockMeanCalculator::GetLatestMean(&_level_increase->framelevel);
  local_31 = _level_increase->minlevel * 40.0 < fVar3;
  bVar1 = false;
  if ((bool)local_31) {
    dVar4 = (double)local_30;
    local_40 = (double)fStack_2c * 0.01;
    local_48 = 1.0;
    pdVar2 = std::max<double>(&local_40,&local_48);
    bVar1 = *pdVar2 <= dVar4 && dVar4 != *pdVar2;
  }
  if (bVar1) {
    this->occurrence_ = this->occurrence_ + 1;
  }
  this->count_ = this->count_ + 1;
  if (this->count_ == 0x19) {
    local_64 = (float)this->occurrence_;
    this->fraction_ = local_64 / 25.0;
    Clear(this);
  }
  return;
}

Assistant:

void DivergentFilterFraction::AddObservation(const PowerLevel& nearlevel,
                                             const PowerLevel& linoutlevel,
                                             const PowerLevel& nlpoutlevel) {
  const float near_level = nearlevel.framelevel.GetLatestMean();
  const float level_increase =
      linoutlevel.framelevel.GetLatestMean() - near_level;
  const bool output_signal_active = nlpoutlevel.framelevel.GetLatestMean() >
          40.0 * nlpoutlevel.minlevel;
  // Level increase should be, in principle, negative, when the filter
  // does not diverge. Here we allow some margin (0.01 * near end level) and
  // numerical error (1.0). We count divergence only when the AEC output
  // signal is active.
  if (output_signal_active &&
      level_increase > std::max(0.01 * near_level, 1.0))
    occurrence_++;
  ++count_;
  if (count_ == kDivergentFilterFractionAggregationWindowSize) {
    fraction_ = static_cast<float>(occurrence_) /
        kDivergentFilterFractionAggregationWindowSize;
    Clear();
  }
}